

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

string * __thiscall lsh::vector::to_string_abi_cxx11_(string *__return_storage_ptr__,vector *this)

{
  uint uVar1;
  string *psVar2;
  bool bVar3;
  uint i;
  string value;
  string __str;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  string *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  uVar1 = this->size_;
  local_78 = local_68;
  local_58 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Vector[","");
  if (uVar1 != 0) {
    i = 0;
    do {
      bVar3 = get(this,i);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],1,(uint)bVar3);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      i = i + 1;
    } while (uVar1 != i);
  }
  psVar2 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)local_58,local_78,local_78 + local_70);
  std::__cxx11::string::append((char *)psVar2);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return psVar2;
}

Assistant:

std::string vector::to_string() const {
    unsigned int n = this->size_;

    std::string value = "Vector[";

    for (unsigned int i = 0; i < n; i++) {
      value += std::to_string(this->get(i));
    }

    return value + "]";
  }